

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xform.cc
# Opt level: O0

XformEvaluator * __thiscall
tinyusdz::anon_unknown_4::XformEvaluator::RotateY(XformEvaluator *this,double angle)

{
  matrix4d local_130;
  double local_b0;
  double s;
  double c;
  double k;
  matrix4d rm;
  double angle_local;
  XformEvaluator *this_local;
  
  rm.m[3][3] = angle;
  tinyusdz::value::matrix4d::identity();
  c = rm.m[3][3] / 180.0;
  s = math::cos_pi(c);
  local_b0 = math::sin_pi(c);
  k = s;
  rm.m[0][1] = -local_b0;
  rm.m[2][1] = s;
  rm.m[1][3] = local_b0;
  tinyusdz::value::operator*(&local_130,&this->m,(matrix4d *)&k);
  memcpy(&this->m,&local_130,0x80);
  return this;
}

Assistant:

XformEvaluator &RotateY(const double angle) {  // in degrees

    value::matrix4d rm = value::matrix4d::identity();

    double k = angle / 180.0;
    double c = math::cos_pi(k);
    double s = math::sin_pi(k);

    rm.m[0][0] = c;
    rm.m[0][2] = -s;
    rm.m[2][0] = s;
    rm.m[2][2] = c;

    m = m * rm;

    return (*this);
  }